

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canLzop(void)

{
  wchar_t wVar1;
  
  if (canLzop::tested == L'\0') {
    canLzop::tested = L'\x01';
    wVar1 = systemf("lzop --help %s",redirectArgs);
    if (wVar1 == L'\0') {
      canLzop::value = L'\x01';
    }
  }
  return canLzop::value;
}

Assistant:

int
canLzop(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lzop --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}